

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5DecodeRowidList(int *pRc,Fts5Buffer *pBuf,u8 *pData,int nData)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  int iVar6;
  u64 iVal;
  u64 local_38;
  
  iVar2 = 0;
  lVar5 = 0;
  while (iVar2 < nData) {
    bVar1 = sqlite3Fts5GetVarint(pData + iVar2,&local_38);
    iVar6 = (uint)bVar1 + iVar2;
    if ((iVar6 < nData) && (pData[iVar6] == '\0')) {
      lVar3 = (long)iVar6 + 1;
      iVar2 = (int)lVar3;
      if (iVar2 < nData) {
        iVar6 = iVar6 + 2;
        if (pData[lVar3] != '\0') {
          iVar6 = iVar2;
        }
        iVar2 = iVar6;
        pcVar4 = "*";
        if (pData[lVar3] == '\0') {
          pcVar4 = "+";
        }
      }
      else {
        pcVar4 = "*";
      }
    }
    else {
      pcVar4 = "";
      iVar2 = iVar6;
    }
    lVar5 = lVar5 + local_38;
    sqlite3Fts5BufferAppendPrintf(pRc,pBuf," %lld%s",lVar5,pcVar4);
  }
  return;
}

Assistant:

static void fts5DecodeRowidList(
  int *pRc,                       /* IN/OUT: Error code */
  Fts5Buffer *pBuf,               /* Buffer to append text to */
  const u8 *pData, int nData      /* Data to decode list-of-rowids from */
){
  int i = 0;
  i64 iRowid = 0;

  while( i<nData ){
    const char *zApp = "";
    u64 iVal;
    i += sqlite3Fts5GetVarint(&pData[i], &iVal);
    iRowid += iVal;

    if( i<nData && pData[i]==0x00 ){
      i++;
      if( i<nData && pData[i]==0x00 ){
        i++;
        zApp = "+";
      }else{
        zApp = "*";
      }
    }

    sqlite3Fts5BufferAppendPrintf(pRc, pBuf, " %lld%s", iRowid, zApp);
  }
}